

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

ostream * smf::MidiFile::writeLittleEndianULong(ostream *out,ulong value)

{
  std::operator<<(out,(char)value);
  std::operator<<(out,(char)(value >> 8));
  std::operator<<(out,(char)(value >> 0x10));
  std::operator<<(out,(char)(value >> 0x18));
  return out;
}

Assistant:

std::ostream& MidiFile::writeLittleEndianULong(std::ostream& out, ulong value) {
	union { char bytes[4]; ulong ul; } data;
	data.ul = value;
	out << data.bytes[0];
	out << data.bytes[1];
	out << data.bytes[2];
	out << data.bytes[3];
	return out;
}